

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t __thiscall
CCharmapToLocalSB::map_utf8
          (CCharmapToLocalSB *this,char *dest,size_t dest_len,utf8_ptr src,size_t src_byte_len,
          size_t *src_bytes_used)

{
  char *pcVar1;
  char *pcVar2;
  ulong in_RDX;
  void *in_RSI;
  utf8_ptr *in_RDI;
  long in_R8;
  long *in_R9;
  size_t map_len;
  uchar *mapping;
  size_t cur_total;
  char *srcend;
  utf8_ptr src_start;
  undefined4 local_58;
  wchar_t in_stack_ffffffffffffffac;
  CCharmapToLocal *in_stack_ffffffffffffffb0;
  size_t local_48;
  utf8_ptr local_38;
  long *local_30;
  long local_28;
  ulong local_20;
  void *local_18;
  utf8_ptr local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pcVar1 = utf8_ptr::getptr(&local_8);
  local_48 = 0;
  while (pcVar2 = utf8_ptr::getptr(&local_8), pcVar2 < pcVar1 + local_28) {
    utf8_ptr::getch((utf8_ptr *)0x23f8d2);
    in_stack_ffffffffffffffb0 =
         (CCharmapToLocal *)
         CCharmapToLocal::get_xlation
                   (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,(size_t *)in_RDI);
    if (local_18 != (void *)0x0) {
      if (local_20 < CONCAT44(in_stack_ffffffffffffffac,local_58)) break;
      memcpy(local_18,in_stack_ffffffffffffffb0,CONCAT44(in_stack_ffffffffffffffac,local_58));
      local_18 = (void *)(CONCAT44(in_stack_ffffffffffffffac,local_58) + (long)local_18);
      local_20 = local_20 - CONCAT44(in_stack_ffffffffffffffac,local_58);
    }
    local_48 = CONCAT44(in_stack_ffffffffffffffac,local_58) + local_48;
    utf8_ptr::inc(in_RDI);
  }
  if (local_30 != (long *)0x0) {
    pcVar1 = utf8_ptr::getptr(&local_8);
    pcVar2 = utf8_ptr::getptr(&local_38);
    *local_30 = (long)pcVar1 - (long)pcVar2;
  }
  return local_48;
}

Assistant:

size_t CCharmapToLocalSB::map_utf8(char *dest, size_t dest_len,
                                   utf8_ptr src, size_t src_byte_len,
                                   size_t *src_bytes_used) const
{
    /* remember where we started */
    utf8_ptr src_start = src;

    /* compute where the source buffer ends */
    char *srcend = src.getptr() + src_byte_len;

    /* copy characters until we reach the end of the source string */
    size_t cur_total;
    for (cur_total = 0 ; src.getptr() < srcend ; src.inc())
    {
        const unsigned char *mapping;
        size_t map_len;
        
        /* get the mapping for this character */
        mapping = get_xlation(src.getch(), &map_len);

        /* 
         *   if we have room, add it; otherwise, zero the output length
         *   remaining so we don't try to add anything more 
         */
        if (dest == 0)
        {
            /* we're just counting */
        }
        else if (map_len <= dest_len)
        {
            /* add the sequence */
            memcpy(dest, mapping, map_len);

            /* adjust the output pointer and length remaining */
            dest += map_len;
            dest_len -= map_len;
        }
        else
        {
            /* it doesn't fit - stop now */
            break;
        }

        /* count the length in the total */
        cur_total += map_len;
    }

    /* if the caller wants to know how much space we used, tell them */
    if (src_bytes_used != 0)
        *src_bytes_used = src.getptr() - src_start.getptr();

    /* return the total length of the result */
    return cur_total;
}